

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

bool save_dds(char *pFilename,uint32_t width,uint32_t height,void *pBlocks,uint32_t pixel_format_bpp
             ,DXGI_FORMAT dxgi_format,bool srgb,bool force_dx10_header)

{
  int iVar1;
  void *in_RCX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  int in_R8D;
  int in_R9D;
  byte in_stack_00000008;
  DDS_HEADER_DXT10 hdr10;
  DDSURFACEDESC2 desc;
  FILE *pFile;
  int local_c8 [3];
  undefined4 local_bc;
  undefined4 local_b4;
  undefined4 local_b0;
  int local_ac;
  int local_a8;
  uint local_a4;
  undefined4 local_6c;
  uint local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_4c;
  FILE *local_38;
  undefined1 local_2a;
  byte local_29;
  int local_28;
  int local_24;
  void *local_20;
  int local_18;
  int local_14;
  char *local_10;
  bool local_1;
  
  local_29 = in_stack_00000008 & 1;
  local_2a = (undefined1)hdr10.dxgiFormat & DXGI_FORMAT_R32G32B32A32_TYPELESS;
  local_38 = (FILE *)0x0;
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_38 = fopen(in_RDI,"wb");
  if (local_38 == (FILE *)0x0) {
    fprintf(_stderr,"Failed creating file %s!\n",local_10);
    local_1 = false;
  }
  else {
    fwrite("DDS ",4,1,local_38);
    memset(&local_b4,0,0x7c);
    local_b4 = 0x7c;
    local_a8 = local_14;
    local_ac = local_18;
    local_4c = 0x1000;
    local_6c = 0x20;
    local_68 = local_68 | 4;
    local_a4 = (local_14 + 3U & 0xfffffffc) * (local_18 + 3U & 0xfffffffc) * local_24 >> 3;
    local_b0 = 0x81007;
    local_60 = 0;
    if (((local_2a & DXGI_FORMAT_R32G32B32A32_TYPELESS) == DXGI_FORMAT_UNKNOWN) &&
       ((((local_28 == 0x47 || (local_28 == 0x4d)) || (local_28 == 0x50)) || (local_28 == 0x53)))) {
      if (local_28 == 0x47) {
        local_64 = 0x31545844;
      }
      else if (local_28 == 0x4d) {
        local_64 = 0x35545844;
      }
      else if (local_28 == 0x50) {
        local_64 = 0x31495441;
      }
      else if (local_28 == 0x53) {
        local_64 = 0x32495441;
      }
      fwrite(&local_b4,0x7c,1,local_38);
    }
    else {
      local_64 = 0x30315844;
      fwrite(&local_b4,0x7c,1,local_38);
      memset(local_c8,0,0x14);
      local_c8[0] = local_28;
      local_c8[1] = 3;
      local_bc = 1;
      fwrite(local_c8,0x14,1,local_38);
    }
    fwrite(local_20,(long)(int)local_a4,1,local_38);
    iVar1 = fclose(local_38);
    if (iVar1 == -1) {
      fprintf(_stderr,"Failed writing to DDS file %s!\n",local_10);
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

static bool save_dds(const char *pFilename, uint32_t width, uint32_t height, const void *pBlocks, uint32_t pixel_format_bpp, DXGI_FORMAT dxgi_format, bool srgb, bool force_dx10_header)
{
	(void)srgb;

	FILE *pFile = NULL;
	pFile = fopen(pFilename, "wb");
	if (!pFile)
	{
		fprintf(stderr, "Failed creating file %s!\n", pFilename);
		return false;
	}

	fwrite("DDS ", 4, 1, pFile);

	DDSURFACEDESC2 desc;
	memset(&desc, 0, sizeof(desc));

	desc.dwSize = sizeof(desc);
	desc.dwFlags = DDSD_WIDTH | DDSD_HEIGHT | DDSD_PIXELFORMAT | DDSD_CAPS;

	desc.dwWidth = width;
	desc.dwHeight = height;

	desc.ddsCaps.dwCaps = DDSCAPS_TEXTURE;
	desc.ddpfPixelFormat.dwSize = sizeof(desc.ddpfPixelFormat);
				
	desc.ddpfPixelFormat.dwFlags |= DDPF_FOURCC;

	desc.lPitch = (((desc.dwWidth + 3) & ~3) * ((desc.dwHeight + 3) & ~3) * pixel_format_bpp) >> 3;
	desc.dwFlags |= DDSD_LINEARSIZE;
	
	desc.ddpfPixelFormat.dwRGBBitCount = 0;

	if ( (!force_dx10_header) &&
		 ((dxgi_format == DXGI_FORMAT_BC1_UNORM) ||
		 (dxgi_format == DXGI_FORMAT_BC3_UNORM) ||
		 (dxgi_format == DXGI_FORMAT_BC4_UNORM) ||
		 (dxgi_format == DXGI_FORMAT_BC5_UNORM)) )
	{
		if (dxgi_format == DXGI_FORMAT_BC1_UNORM)
			desc.ddpfPixelFormat.dwFourCC = (uint32_t)PIXEL_FMT_FOURCC('D', 'X', 'T', '1');
		else if (dxgi_format == DXGI_FORMAT_BC3_UNORM)
			desc.ddpfPixelFormat.dwFourCC = (uint32_t)PIXEL_FMT_FOURCC('D', 'X', 'T', '5');
		else if (dxgi_format == DXGI_FORMAT_BC4_UNORM)
			desc.ddpfPixelFormat.dwFourCC = (uint32_t)PIXEL_FMT_FOURCC('A', 'T', 'I', '1');
		else if (dxgi_format == DXGI_FORMAT_BC5_UNORM)
			desc.ddpfPixelFormat.dwFourCC = (uint32_t)PIXEL_FMT_FOURCC('A', 'T', 'I', '2');

		fwrite(&desc, sizeof(desc), 1, pFile);
	}
	else
	{
		desc.ddpfPixelFormat.dwFourCC = (uint32_t)PIXEL_FMT_FOURCC('D', 'X', '1', '0');
						
		fwrite(&desc, sizeof(desc), 1, pFile);

		DDS_HEADER_DXT10 hdr10;
		memset(&hdr10, 0, sizeof(hdr10));

		// Not all tools support DXGI_FORMAT_BC7_UNORM_SRGB (like NVTT), but ddsview in DirectXTex pays attention to it. So not sure what to do here.
		// For best compatibility just write DXGI_FORMAT_BC7_UNORM.
		//hdr10.dxgiFormat = srgb ? DXGI_FORMAT_BC7_UNORM_SRGB : DXGI_FORMAT_BC7_UNORM;
		hdr10.dxgiFormat = dxgi_format; // DXGI_FORMAT_BC7_UNORM;
		hdr10.resourceDimension = D3D10_RESOURCE_DIMENSION_TEXTURE2D;
		hdr10.arraySize = 1;

		fwrite(&hdr10, sizeof(hdr10), 1, pFile);
	}

	fwrite(pBlocks, desc.lPitch, 1, pFile);

	if (fclose(pFile) == EOF)
	{
		fprintf(stderr, "Failed writing to DDS file %s!\n", pFilename);
		return false;
	}

	return true;
}